

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentalProcessPdu.cpp
# Opt level: O3

void __thiscall
DIS::EnvironmentalProcessPdu::unmarshal(EnvironmentalProcessPdu *this,DataStream *dataStream)

{
  uchar *c;
  pointer *ppEVar1;
  pointer pEVar2;
  pointer pEVar3;
  iterator __position;
  pointer pEVar4;
  ulong uVar5;
  Environment x;
  Environment local_48;
  
  SyntheticEnvironmentFamilyPdu::unmarshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_environementalProcessID,dataStream);
  EntityType::unmarshal(&this->_environmentType,dataStream);
  DataStream::operator>>(dataStream,&this->_modelType);
  DataStream::operator>>(dataStream,&this->_environmentStatus);
  c = &this->_numberOfEnvironmentRecords;
  DataStream::operator>>(dataStream,c);
  DataStream::operator>>(dataStream,&this->_sequenceNumber);
  pEVar2 = (this->_environmentRecords).
           super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar3 = (this->_environmentRecords).
           super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar4 = pEVar2;
  if (pEVar3 != pEVar2) {
    do {
      (**pEVar4->_vptr_Environment)(pEVar4);
      pEVar4 = pEVar4 + 1;
    } while (pEVar4 != pEVar3);
    (this->_environmentRecords).
    super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar2;
  }
  if (*c != '\0') {
    uVar5 = 0;
    do {
      Environment::Environment(&local_48);
      Environment::unmarshal(&local_48,dataStream);
      __position._M_current =
           (this->_environmentRecords).
           super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_environmentRecords).
          super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<DIS::Environment,std::allocator<DIS::Environment>>::
        _M_realloc_insert<DIS::Environment_const&>
                  ((vector<DIS::Environment,std::allocator<DIS::Environment>> *)
                   &this->_environmentRecords,__position,&local_48);
      }
      else {
        (__position._M_current)->_vptr_Environment = (_func_int **)&PTR__Environment_0019fed8;
        (__position._M_current)->_environmentType = local_48._environmentType;
        (__position._M_current)->_length = local_48._length;
        (__position._M_current)->_index = local_48._index;
        (__position._M_current)->_padding1 = local_48._padding1;
        (__position._M_current)->_geometry = local_48._geometry;
        (__position._M_current)->_padding2 = local_48._padding2;
        ppEVar1 = &(this->_environmentRecords).
                   super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppEVar1 = *ppEVar1 + 1;
      }
      Environment::~Environment(&local_48);
      uVar5 = uVar5 + 1;
    } while (uVar5 < *c);
  }
  return;
}

Assistant:

void EnvironmentalProcessPdu::unmarshal(DataStream& dataStream)
{
    SyntheticEnvironmentFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _environementalProcessID.unmarshal(dataStream);
    _environmentType.unmarshal(dataStream);
    dataStream >> _modelType;
    dataStream >> _environmentStatus;
    dataStream >> _numberOfEnvironmentRecords;
    dataStream >> _sequenceNumber;

     _environmentRecords.clear();
     for(size_t idx = 0; idx < _numberOfEnvironmentRecords; idx++)
     {
        Environment x;
        x.unmarshal(dataStream);
        _environmentRecords.push_back(x);
     }
}